

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC16NoTop_SSE2(uint8_t *dst)

{
  uint8_t *in_RDI;
  int j;
  int DC;
  int local_10;
  int local_c;
  
  local_c = 8;
  for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
    local_c = (uint)in_RDI[local_10 * 0x20 + -1] + local_c;
  }
  Put16_SSE2((uint8_t)(local_c >> 4),in_RDI);
  return;
}

Assistant:

static void DC16NoTop_SSE2(uint8_t* dst) {  // DC with top samples unavailable
  int DC = 8;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS];
  }
  Put16_SSE2(DC >> 4, dst);
}